

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::Logger::Logger(Logger *this)

{
  _Rb_tree_header *p_Var1;
  LoggerClient *c;
  
  (this->super_Environment).super_Counted.nb_refs_ = 0;
  (this->super_Environment).environments_.
  super__Vector_base<GEO::SmartPointer<GEO::Environment>,_std::allocator<GEO::SmartPointer<GEO::Environment>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Environment).environments_.
  super__Vector_base<GEO::SmartPointer<GEO::Environment>,_std::allocator<GEO::SmartPointer<GEO::Environment>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Environment).environments_.
  super__Vector_base<GEO::SmartPointer<GEO::Environment>,_std::allocator<GEO::SmartPointer<GEO::Environment>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->super_Environment).observers_._M_t._M_impl.super__Rb_tree_header;
  (this->super_Environment).observers_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_Environment).observers_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_Environment).observers_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_Environment).observers_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_Environment).observers_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Environment).super_Counted._vptr_Counted = (_func_int **)&PTR__Logger_001a7640;
  LoggerStream::LoggerStream(&this->out_,this);
  LoggerStream::LoggerStream(&this->warn_,this);
  LoggerStream::LoggerStream(&this->err_,this);
  LoggerStream::LoggerStream(&this->status_,this);
  p_Var1 = &(this->log_features_)._M_t._M_impl.super__Rb_tree_header;
  (this->log_features_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->log_features_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->log_features_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->log_features_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->log_features_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header;
  (this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->log_everything_ = true;
  (this->log_file_name_)._M_dataplus._M_p = (pointer)&(this->log_file_name_).field_2;
  (this->log_file_name_)._M_string_length = 0;
  (this->log_file_name_).field_2._M_local_buf[0] = '\0';
  (this->current_feature_)._M_dataplus._M_p = (pointer)&(this->current_feature_).field_2;
  (this->current_feature_)._M_string_length = 0;
  (this->current_feature_).field_2._M_local_buf[0] = '\0';
  this->current_feature_changed_ = false;
  p_Var1 = &(this->clients_)._M_t._M_impl.super__Rb_tree_header;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->quiet_ = true;
  this->pretty_ = true;
  this->minimal_ = false;
  this->notifying_error_ = false;
  c = (LoggerClient *)operator_new(0x10);
  ConsoleLogger::ConsoleLogger((ConsoleLogger *)c);
  register_client(this,c);
  return;
}

Assistant:

Logger::Logger() :
        out_(this),
        warn_(this),
        err_(this),
        status_(this),
        log_everything_(true),
        current_feature_changed_(false),
        quiet_(true),
        pretty_(true),
        minimal_(false),
	notifying_error_(false)
    {
        // Add a default client printing stuff to std::cout
        register_client(new ConsoleLogger());
#ifdef GEO_DEBUG
        quiet_ = false;
#endif        
    }